

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

vec3 polyscope::view::getFrontVec(void)

{
  vec3 vVar1;
  vec3 vVar2;
  
  switch(frontDir) {
  case 0:
    vVar1._0_8_ = SUB648(ZEXT464(0x3f800000),0);
    vVar1.field_2.z = 0.0;
    return vVar1;
  case 1:
    return (vec3)ZEXT812(0x3f80000000000000);
  case 2:
    return (vec3)(ZEXT412(0x3f800000) << 0x40);
  case 3:
    vVar2._0_8_ = SUB648(ZEXT464(0xbf800000),0);
    vVar2.field_2.z = 0.0;
    return vVar2;
  case 4:
    return (vec3)ZEXT812(0xbf80000000000000);
  case 5:
    return (vec3)(ZEXT412(0xbf800000) << 0x40);
  default:
    return (vec3)ZEXT812(0);
  }
}

Assistant:

glm::vec3 getFrontVec() {
  switch (frontDir) {
  case FrontDir::NegXFront:
    return glm::vec3{-1., 0., 0.};
  case FrontDir::XFront:
    return glm::vec3{1., 0., 0.};
  case FrontDir::NegYFront:
    return glm::vec3{0., -1., 0.};
  case FrontDir::YFront:
    return glm::vec3{0., 1., 0.};
  case FrontDir::NegZFront:
    return glm::vec3{0., 0., -1.};
  case FrontDir::ZFront:
    return glm::vec3{0., 0., 1.};
  }

  // unused fallthrough
  return glm::vec3{0., 0., 0.};
}